

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool __thiscall libcellml::Model::linkUnits(Model *this)

{
  bool bVar1;
  enable_shared_from_this<libcellml::Model> local_30;
  shared_ptr<libcellml::ComponentEntity> local_20;
  Model *local_10;
  Model *this_local;
  
  local_10 = this;
  std::enable_shared_from_this<libcellml::Model>::shared_from_this(&local_30);
  std::shared_ptr<libcellml::ComponentEntity>::shared_ptr<libcellml::Model,void>
            (&local_20,(shared_ptr<libcellml::Model> *)&local_30);
  bVar1 = traverseComponentEntityTreeLinkingUnits(&local_20);
  std::shared_ptr<libcellml::ComponentEntity>::~shared_ptr(&local_20);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&local_30);
  return bVar1;
}

Assistant:

bool Model::linkUnits()
{
    return traverseComponentEntityTreeLinkingUnits(shared_from_this());
}